

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

vector<char_data_*,_std::allocator<char_data_*>_> * __thiscall
CQueue::GetCharacterData<char_data*&,char_data*&,char_const(&)[48],std::__cxx11::string&>
          (CQueue *this,
          tuple<char_data_*&,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *t)

{
  tuple<char_data_*&,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_RDI;
  vector<char_data_*,_std::allocator<char_data_*>_> *accumulator;
  tuple<char_data_*&,_char_data_*&,_const_char_(&)[48],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *__f;
  
  __f = in_RDI;
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)0x67b0d9);
  std::
  apply<CQueue::GetCharacterData<char_data*&,char_data*&,char_const(&)[48],std::__cxx11::string&>(std::tuple<char_data*&,char_data*&,char_const(&)[48],std::__cxx11::string&>&)::_lambda((auto:1_const&)___)_1_,std::tuple<char_data*&,char_data*&,char_const(&)[48],std::__cxx11::string&>&>
            ((anon_class_8_1_18cdd2e6 *)__f,in_RDI);
  return (vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDI;
}

Assistant:

std::vector<CHAR_DATA*> GetCharacterData(std::tuple<Tp...>& t)
	{
		std::vector<CHAR_DATA*> accumulator;

		std::apply([&] (const auto&... tupleArgs) 
		{
			auto processTuple = [&](const auto& x)
			{
				// decay x to get the actual argument type to compare to our character data type 
		 		if constexpr (std::is_same<typename std::decay<decltype(x)>::type,CHAR_DATA*>::value)
					accumulator.push_back(x);
			};
			(processTuple(tupleArgs), ...);  // fold expression - calls processTuple for each argument in tupleArgs
		}, t);

		return accumulator;
	}